

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_spell_book_teleport_on_use.hpp
# Opt level: O3

void __thiscall
PatchSpellBookTeleportOnUse::inject_code(PatchSpellBookTeleportOnUse *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  mapped_type *ppIVar2;
  Code func_pre_use;
  string local_c8;
  Code local_a8;
  Param local_30;
  undefined8 local_28;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->_consumable_spell_book == true) {
    local_c8._M_string_length = local_c8._M_string_length & 0xffffffffffffff00;
    local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00262be0;
    local_30._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
    local_28 = 0x200ff1152;
    md::Code::move(&local_a8,(Param *)&local_c8,&local_30,BYTE);
    local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00262cd8;
    local_c8._M_string_length = 0x200008b98;
    md::Code::jsr(&local_a8,(Param *)&local_c8);
  }
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00262cd8;
  local_c8._M_string_length = 0x200008bb2;
  md::Code::jmp(&local_a8,(Param *)&local_c8);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  uVar1 = md::ROM::inject_code(rom,&local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p._0_1_ = 0x24;
  ppIVar2 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::at(&world->_items,(key_type_conflict *)&local_c8);
  (*(*ppIVar2)->_vptr_Item[2])(*ppIVar2,(ulong)uVar1);
  uVar1 = inject_func_warp_to_start(rom,world);
  local_c8._M_dataplus._M_p._0_1_ = 0x24;
  ppIVar2 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::at(&world->_items,(key_type_conflict *)&local_c8);
  (*(*ppIVar2)->_vptr_Item[3])(*ppIVar2,(ulong)uVar1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Replace "consume Spell Book" by a return indicating success and signaling there is a post-use effect
        // to handle.
        md::Code func_pre_use;
        if(_consumable_spell_book)
        {
            func_pre_use.moveb(reg_D0, addr_(0xFF1152));
            func_pre_use.jsr(0x8B98); // ConsumeItem
        }
        func_pre_use.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS_HAS_POST_USE);
        uint32_t func_pre_use_addr = rom.inject_code(func_pre_use);
        world.item(ITEM_SPELL_BOOK)->pre_use_address(func_pre_use_addr);

        uint32_t func_warp_to_start = inject_func_warp_to_start(rom, world);
        world.item(ITEM_SPELL_BOOK)->post_use_address(func_warp_to_start);
    }